

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<int_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,double *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  size_type sVar2;
  double *in_R8;
  long *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long local_80;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  bool local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  local_80 = -(ulong)((double)*(int *)this_00 != *rhs);
  local_e0 = (long *)&local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"!=","");
  if (local_e0 == (long *)&local_d0) {
    uStack_60 = uStack_c8;
    local_78 = &local_68;
  }
  else {
    local_78 = local_e0;
  }
  local_68 = CONCAT71(uStack_cf,local_d0);
  local_70 = local_d8;
  local_d8 = 0;
  local_d0 = 0;
  local_e0 = (long *)&local_d0;
  to_string<int,double>(&local_c0,this_00,(int *)&local_78,(string *)rhs,in_R8);
  sVar2 = local_c0._M_string_length;
  local_58 = (bool)((byte)local_80 & 1);
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    local_90._8_8_ = local_c0.field_2._8_8_;
    local_a0 = &local_90;
  }
  else {
    local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c0._M_dataplus._M_p;
  }
  local_90._M_allocated_capacity._1_7_ = local_c0.field_2._M_allocated_capacity._1_7_;
  local_90._M_local_buf[0] = local_c0.field_2._M_local_buf[0];
  local_98 = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_a0,local_a0->_M_local_buf + sVar2);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_e0 != (long *)&local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }